

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O0

void __thiscall FluidSynthMIDIDevice::FluidSynthMIDIDevice(FluidSynthMIDIDevice *this,char *args)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  _func_fluid_settings_t_ptr *p_Var4;
  fluid_settings_t *pfVar5;
  _func_int_fluid_settings_t_ptr_char_ptr_double *p_Var6;
  _func_int_fluid_settings_t_ptr_char_ptr_int *p_Var7;
  _func_fluid_synth_t_ptr_fluid_settings_t_ptr *p_Var8;
  fluid_synth_t *pfVar9;
  _func_int_fluid_synth_t_ptr_int_int *p_Var10;
  _func_void_fluid_synth_t_ptr_double_double_double_double *p_Var11;
  _func_void_fluid_synth_t_ptr_int_double_double_double_int *p_Var12;
  char *patches;
  _func_int_fluid_synth_t_ptr *p_Var13;
  float extraout_XMM0_Da;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int local_28;
  int res;
  char *args_local;
  FluidSynthMIDIDevice *this_local;
  
  SoftSynthMIDIDevice::SoftSynthMIDIDevice(&this->super_SoftSynthMIDIDevice);
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__FluidSynthMIDIDevice_009f0df0;
  this->FluidSynth = (fluid_synth_t *)0x0;
  this->FluidSettings = (fluid_settings_t *)0x0;
  bVar1 = LoadFluidSynth(this);
  if (bVar1) {
    p_Var4 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&new_fluid_settings);
    pfVar5 = (*p_Var4)();
    this->FluidSettings = pfVar5;
    if (this->FluidSettings == (fluid_settings_t *)0x0) {
      printf("Failed to create FluidSettings.\n");
    }
    else {
      iVar2 = FIntCVar::operator_cast_to_int(&fluid_samplerate);
      (this->super_SoftSynthMIDIDevice).SampleRate = iVar2;
      if (((this->super_SoftSynthMIDIDevice).SampleRate < 0x5622) ||
         (96000 < (this->super_SoftSynthMIDIDevice).SampleRate)) {
        (*GSnd->_vptr_SoundRenderer[10])();
        iVar2 = clamp<int>((int)extraout_XMM0_Da,0x5622,96000);
        (this->super_SoftSynthMIDIDevice).SampleRate = iVar2;
      }
      p_Var6 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setnum);
      (*p_Var6)(this->FluidSettings,"synth.sample-rate",
                (double)(this->super_SoftSynthMIDIDevice).SampleRate);
      p_Var6 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setnum);
      pfVar5 = this->FluidSettings;
      fVar14 = FFloatCVar::operator_cast_to_float(&fluid_gain);
      (*p_Var6)(pfVar5,"synth.gain",(double)fVar14);
      p_Var7 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
      pfVar5 = this->FluidSettings;
      bVar1 = FBoolCVar::operator_cast_to_bool(&fluid_reverb);
      (*p_Var7)(pfVar5,"synth.reverb.active",(uint)bVar1);
      p_Var7 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
      pfVar5 = this->FluidSettings;
      bVar1 = FBoolCVar::operator_cast_to_bool(&fluid_chorus);
      (*p_Var7)(pfVar5,"synth.chorus.active",(uint)bVar1);
      p_Var7 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
      pfVar5 = this->FluidSettings;
      iVar2 = FIntCVar::operator_cast_to_int(&fluid_voices);
      (*p_Var7)(pfVar5,"synth.polyphony",iVar2);
      p_Var7 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
      pfVar5 = this->FluidSettings;
      iVar2 = FIntCVar::operator_cast_to_int(&fluid_threads);
      (*p_Var7)(pfVar5,"synth.cpu-cores",iVar2);
      p_Var8 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&new_fluid_synth);
      pfVar9 = (*p_Var8)(this->FluidSettings);
      this->FluidSynth = pfVar9;
      if (this->FluidSynth == (fluid_synth_t *)0x0) {
        Printf("Failed to create FluidSynth.\n");
      }
      else {
        p_Var10 = ::TReqProc::operator_cast_to_function_pointer
                            ((TReqProc *)&fluid_synth_set_interp_method);
        pfVar9 = this->FluidSynth;
        iVar2 = FIntCVar::operator_cast_to_int(&fluid_interp);
        (*p_Var10)(pfVar9,-1,iVar2);
        p_Var11 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_set_reverb)
        ;
        pfVar9 = this->FluidSynth;
        fVar14 = FFloatCVar::operator_cast_to_float(&fluid_reverb_roomsize);
        fVar15 = FFloatCVar::operator_cast_to_float(&fluid_reverb_damping);
        fVar16 = FFloatCVar::operator_cast_to_float(&fluid_reverb_width);
        fVar17 = FFloatCVar::operator_cast_to_float(&fluid_reverb_level);
        (*p_Var11)(pfVar9,(double)fVar14,(double)fVar15,(double)fVar16,(double)fVar17);
        p_Var12 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_set_chorus)
        ;
        pfVar9 = this->FluidSynth;
        iVar2 = FIntCVar::operator_cast_to_int(&fluid_chorus_voices);
        fVar14 = FFloatCVar::operator_cast_to_float(&fluid_chorus_level);
        fVar15 = FFloatCVar::operator_cast_to_float(&fluid_chorus_speed);
        fVar16 = FFloatCVar::operator_cast_to_float(&fluid_chorus_depth);
        iVar3 = FIntCVar::operator_cast_to_int(&fluid_chorus_type);
        (*p_Var12)(pfVar9,iVar2,(double)fVar14,(double)fVar15,(double)fVar16,iVar3);
        local_28 = 0;
        if ((args != (char *)0x0) && (*args != '\0')) {
          local_28 = LoadPatchSets(this,args);
        }
        if (local_28 == 0) {
          patches = FStringCVar::operator_cast_to_char_(&fluid_patchset);
          iVar2 = LoadPatchSets(this,patches);
          if ((iVar2 == 0) &&
             (iVar2 = LoadPatchSets(this,
                                    "/usr/share/sounds/sf2/FluidR3_GS.sf2:/usr/share/sounds/sf2/FluidR3_GM.sf2"
                                   ), iVar2 == 0)) {
            Printf("Failed to load any MIDI patches.\n");
            p_Var13 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&delete_fluid_synth)
            ;
            (*p_Var13)(this->FluidSynth);
            this->FluidSynth = (fluid_synth_t *)0x0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

FluidSynthMIDIDevice::FluidSynthMIDIDevice(const char *args)
{
	FluidSynth = NULL;
	FluidSettings = NULL;
#ifdef DYN_FLUIDSYNTH
	if (!LoadFluidSynth())
	{
		return;
	}
#endif
	FluidSettings = new_fluid_settings();
	if (FluidSettings == NULL)
	{
		printf("Failed to create FluidSettings.\n");
		return;
	}
	SampleRate = fluid_samplerate;
	if (SampleRate < 22050 || SampleRate > 96000)
	{ // Match sample rate to SFX rate
		SampleRate = clamp((int)GSnd->GetOutputRate(), 22050, 96000);
	}
	fluid_settings_setnum(FluidSettings, "synth.sample-rate", SampleRate);
	fluid_settings_setnum(FluidSettings, "synth.gain", fluid_gain);
	fluid_settings_setint(FluidSettings, "synth.reverb.active", fluid_reverb);
	fluid_settings_setint(FluidSettings, "synth.chorus.active", fluid_chorus);
	fluid_settings_setint(FluidSettings, "synth.polyphony", fluid_voices);
	fluid_settings_setint(FluidSettings, "synth.cpu-cores", fluid_threads);
	FluidSynth = new_fluid_synth(FluidSettings);
	if (FluidSynth == NULL)
	{
		Printf("Failed to create FluidSynth.\n");
		return;
	}
	fluid_synth_set_interp_method(FluidSynth, -1, fluid_interp);
	fluid_synth_set_reverb(FluidSynth, fluid_reverb_roomsize, fluid_reverb_damping,
		fluid_reverb_width, fluid_reverb_level);
	fluid_synth_set_chorus(FluidSynth, fluid_chorus_voices, fluid_chorus_level,
		fluid_chorus_speed, fluid_chorus_depth, fluid_chorus_type);

	// try loading a patch set that got specified with $mididevice.
	int res = 0;
	if (args != NULL && *args != 0)
	{
		res = LoadPatchSets(args);
	}

	if (res == 0 && 0 == LoadPatchSets(fluid_patchset))
	{
#ifdef __unix__
		// This is the standard location on Ubuntu.
		if (0 == LoadPatchSets("/usr/share/sounds/sf2/FluidR3_GS.sf2:/usr/share/sounds/sf2/FluidR3_GM.sf2"))
		{
#endif
#ifdef _WIN32
		// On Windows, look for the 4 megabyte patch set installed by Creative's drivers as a default.
		char sysdir[MAX_PATH+sizeof("\\CT4MGM.SF2")];
		UINT filepart;
		if (0 != (filepart = GetSystemDirectoryA(sysdir, MAX_PATH)))
		{
			strcat(sysdir, "\\CT4MGM.SF2");
			if (0 == LoadPatchSets(sysdir))
			{
				// Try again with CT2MGM.SF2
				sysdir[filepart + 3] = '2';
				if (0 == LoadPatchSets(sysdir))
				{
#endif
					Printf("Failed to load any MIDI patches.\n");
					delete_fluid_synth(FluidSynth);
					FluidSynth = NULL;
#ifdef _WIN32
				}
			}
		}
#endif
#ifdef __unix__
		}
#endif
	}
}